

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O1

void Gia_PolynBuildOne(Pln_Man_t *p,int iMono)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Hsh_VecMan_t *pHVar4;
  Gia_Man_t *pGVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  Vec_Int_t *vTempC;
  ulong uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  
  pHVar4 = p->pHashM;
  pVVar10 = p->vCoefs;
  iVar2 = pHVar4->vMap->nSize;
  if (pVVar10->nSize != iVar2) {
    __assert_fail("Vec_IntSize(p->vCoefs) == Hsh_VecSize(p->pHashM)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                  ,0x109,"void Gia_PolynBuildOne(Pln_Man_t *, int)");
  }
  if ((iMono < 0) || (iVar2 <= iMono)) goto LAB_00679f3c;
  iVar2 = pHVar4->vMap->pArray[(uint)iMono];
  if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) goto LAB_00679f1d;
  piVar1 = pHVar4->vData->pArray + iVar2;
  iVar2 = *piVar1;
  (pHVar4->vTemp).nCap = iVar2;
  (pHVar4->vTemp).nSize = iVar2;
  (pHVar4->vTemp).pArray = piVar1 + 2;
  if ((long)iVar2 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  iVar2 = (pHVar4->vTemp).pArray[(long)iVar2 + -1];
  lVar14 = (long)iVar2;
  if (lVar14 < 0) {
LAB_00679f5b:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar5 = p->pGia;
  if (pGVar5->nObjs <= iVar2) goto LAB_00679f5b;
  pGVar6 = pGVar5->pObjs;
  uVar3 = *(uint *)(pGVar6 + lVar14);
  if ((~uVar3 & 0x1fffffff) == 0 || (int)uVar3 < 0) {
    return;
  }
  if (pGVar5->nObjs <= iVar2) {
LAB_00679fb8:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((pGVar5->pMuxes != (uint *)0x0) && (pGVar5->pMuxes[lVar14] != 0)) {
    __assert_fail("!Gia_ObjIsMux(p->pGia, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                  ,0x10f,"void Gia_PolynBuildOne(Pln_Man_t *, int)");
  }
  if (pVVar10->nSize <= iMono) goto LAB_00679f3c;
  uVar3 = pVVar10->pArray[(uint)iMono];
  uVar11 = (ulong)uVar3;
  if (uVar11 == 0) {
    return;
  }
  pVVar10->pArray[(uint)iMono] = 0;
  p->nUsed = p->nUsed + -1;
  if (pGVar5->nObjs <= iVar2) goto LAB_00679fb8;
  pGVar6 = pGVar6 + lVar14;
  uVar7 = *(ulong *)pGVar6;
  uVar12 = 0;
  do {
    pVVar10 = p->vTempM[uVar12];
    pVVar10->nSize = 0;
    if (0 < (pHVar4->vTemp).nSize) {
      lVar14 = 0;
      do {
        Vec_IntPush(pVVar10,(pHVar4->vTemp).pArray[lVar14]);
        lVar14 = lVar14 + 1;
      } while (lVar14 < (pHVar4->vTemp).nSize);
    }
    pVVar10 = p->vTempM[uVar12];
    if (pVVar10->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    pVVar10->nSize = pVVar10->nSize + -1;
    if ((uVar12 & 1) != 0) {
      Vec_IntPushUniqueOrderCost(pVVar10,iVar2 - ((uint)uVar7 & 0x1fffffff),p->vOrder);
    }
    if (1 < uVar12) {
      Vec_IntPushUniqueOrderCost
                (p->vTempM[uVar12],iVar2 - ((uint)(uVar7 >> 0x20) & 0x1fffffff),p->vOrder);
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 4);
  if ((int)uVar3 < 0) {
LAB_00679f3c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pHVar4 = p->pHashC;
  if (pHVar4->vMap->nSize <= (int)uVar3) goto LAB_00679f3c;
  iVar2 = pHVar4->vMap->pArray[uVar11];
  if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) goto LAB_00679f1d;
  piVar1 = pHVar4->vData->pArray + iVar2;
  iVar2 = *piVar1;
  (pHVar4->vTemp).nCap = iVar2;
  (pHVar4->vTemp).nSize = iVar2;
  (pHVar4->vTemp).pArray = piVar1 + 2;
  uVar9 = (uint)*(ulong *)pGVar6;
  if (((~uVar9 & 0x1fffffff) == 0 || (int)uVar9 < 0) ||
     (((uint)(*(ulong *)pGVar6 >> 0x20) & 0x1fffffff) <= (uVar9 & 0x1fffffff))) {
    lVar14 = 0;
    do {
      pVVar10 = p->vTempC[lVar14];
      pVVar10->nSize = 0;
      if (0 < (pHVar4->vTemp).nSize) {
        lVar13 = 0;
        do {
          iVar2 = (pHVar4->vTemp).pArray[lVar13];
          iVar8 = -iVar2;
          if (lVar14 == 0) {
            iVar8 = iVar2;
          }
          Vec_IntPush(pVVar10,iVar8);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (pHVar4->vTemp).nSize);
      }
      bVar15 = lVar14 == 0;
      lVar14 = lVar14 + 1;
    } while (bVar15);
  }
  uVar7 = *(ulong *)pGVar6;
  uVar9 = (uint)uVar7;
  if (((~uVar9 & 0x1fffffff) == 0 || (int)uVar9 < 0) ||
     (((uint)(uVar7 >> 0x20) & 0x1fffffff) <= (uVar9 & 0x1fffffff))) {
    if ((uVar9 >> 0x1d & 1) == 0) {
LAB_00679dde:
      vTempC = p->vTempC[0];
      if ((uVar7 & 0x2000000000000000) == 0) goto LAB_00679ee4;
      pVVar10 = p->vTempM[1];
    }
    else {
      if ((uVar7 & 0x2000000000000000) != 0) {
        Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[0]);
        Gia_PolynBuildAdd(p,p->vTempC[1],p->vTempM[1]);
        pHVar4 = p->pHashC;
        if (pHVar4->vMap->nSize <= (int)uVar3) goto LAB_00679f3c;
        iVar2 = pHVar4->vMap->pArray[uVar11];
        if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) goto LAB_00679f1d;
        piVar1 = pHVar4->vData->pArray + iVar2;
        iVar2 = *piVar1;
        (pHVar4->vTemp).nCap = iVar2;
        (pHVar4->vTemp).nSize = iVar2;
        (pHVar4->vTemp).pArray = piVar1 + 2;
        lVar14 = 0;
        do {
          pVVar10 = p->vTempC[lVar14];
          pVVar10->nSize = 0;
          if (0 < (pHVar4->vTemp).nSize) {
            lVar13 = 0;
            do {
              iVar2 = (pHVar4->vTemp).pArray[lVar13];
              iVar8 = -iVar2;
              if (lVar14 == 0) {
                iVar8 = iVar2;
              }
              Vec_IntPush(pVVar10,iVar8);
              lVar13 = lVar13 + 1;
            } while (lVar13 < (pHVar4->vTemp).nSize);
          }
          bVar15 = lVar14 == 0;
          lVar14 = lVar14 + 1;
        } while (bVar15);
        Gia_PolynBuildAdd(p,p->vTempC[1],p->vTempM[2]);
        goto LAB_00679ee0;
      }
      if ((uVar9 >> 0x1d & 1) == 0) goto LAB_00679dde;
      vTempC = p->vTempC[0];
      pVVar10 = p->vTempM[2];
    }
    Gia_PolynBuildAdd(p,vTempC,pVVar10);
    vTempC = p->vTempC[1];
  }
  else {
    pHVar4 = p->pHashC;
    if (pHVar4->vMap->nSize <= (int)uVar3) goto LAB_00679f3c;
    iVar2 = pHVar4->vMap->pArray[uVar11];
    if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) {
LAB_00679f1d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar1 = pHVar4->vData->pArray + iVar2;
    iVar2 = *piVar1;
    (pHVar4->vTemp).nCap = iVar2;
    (pHVar4->vTemp).nSize = iVar2;
    (pHVar4->vTemp).pArray = piVar1 + 2;
    pVVar10 = p->vTempC[0];
    pVVar10->nSize = 0;
    if (0 < (pHVar4->vTemp).nSize) {
      lVar14 = 0;
      do {
        Vec_IntPush(pVVar10,(pHVar4->vTemp).pArray[lVar14]);
        lVar14 = lVar14 + 1;
      } while (lVar14 < (pHVar4->vTemp).nSize);
    }
    Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[1]);
    pHVar4 = p->pHashC;
    if (pHVar4->vMap->nSize <= (int)uVar3) goto LAB_00679f3c;
    iVar2 = pHVar4->vMap->pArray[uVar11];
    if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) goto LAB_00679f1d;
    piVar1 = pHVar4->vData->pArray + iVar2;
    iVar2 = *piVar1;
    (pHVar4->vTemp).nCap = iVar2;
    (pHVar4->vTemp).nSize = iVar2;
    (pHVar4->vTemp).pArray = piVar1 + 2;
    pVVar10 = p->vTempC[0];
    pVVar10->nSize = 0;
    if (0 < (pHVar4->vTemp).nSize) {
      lVar14 = 0;
      do {
        Vec_IntPush(pVVar10,(pHVar4->vTemp).pArray[lVar14]);
        lVar14 = lVar14 + 1;
      } while (lVar14 < (pHVar4->vTemp).nSize);
    }
    Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[2]);
    pHVar4 = p->pHashC;
    if (pHVar4->vMap->nSize <= (int)uVar3) goto LAB_00679f3c;
    iVar2 = pHVar4->vMap->pArray[uVar11];
    if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) goto LAB_00679f1d;
    piVar1 = pHVar4->vData->pArray + iVar2;
    iVar2 = *piVar1;
    (pHVar4->vTemp).nCap = iVar2;
    (pHVar4->vTemp).nSize = iVar2;
    (pHVar4->vTemp).pArray = piVar1 + 2;
    pVVar10 = p->vTempC[0];
    pVVar10->nSize = 0;
    if (0 < (pHVar4->vTemp).nSize) {
      lVar14 = 0;
      do {
        uVar3 = (pHVar4->vTemp).pArray[lVar14];
        uVar9 = ~uVar3;
        if ((int)uVar3 < 1) {
          uVar9 = 1 - uVar3;
        }
        Vec_IntPush(pVVar10,uVar9);
        lVar14 = lVar14 + 1;
      } while (lVar14 < (pHVar4->vTemp).nSize);
    }
LAB_00679ee0:
    vTempC = p->vTempC[0];
  }
LAB_00679ee4:
  Gia_PolynBuildAdd(p,vTempC,p->vTempM[3]);
  return;
}

Assistant:

void Gia_PolynBuildOne( Pln_Man_t * p, int iMono )
{
    Gia_Obj_t * pObj; 
    Vec_Int_t * vArray, * vConst;
    int iFan0, iFan1;
    int k, iConst, iDriver;

    assert( Vec_IntSize(p->vCoefs) == Hsh_VecSize(p->pHashM) );
    vArray  = Hsh_VecReadEntry( p->pHashM, iMono );
    iDriver = Vec_IntEntryLast( vArray );
    pObj    = Gia_ManObj( p->pGia, iDriver );
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    assert( !Gia_ObjIsMux(p->pGia, pObj) );

    iConst = Vec_IntEntry( p->vCoefs, iMono );
    if ( iConst == 0 )
        return;
    Vec_IntWriteEntry( p->vCoefs, iMono, 0 );
    p->nUsed--;

    iFan0 = Gia_ObjFaninId0p(p->pGia, pObj);
    iFan1 = Gia_ObjFaninId1p(p->pGia, pObj);
    for ( k = 0; k < 4; k++ )
    {
        Vec_IntClear( p->vTempM[k] );
        Vec_IntAppend( p->vTempM[k], vArray );
        Vec_IntPop( p->vTempM[k] );
        if ( k == 1 || k == 3 )
            Vec_IntPushUniqueOrderCost( p->vTempM[k], iFan0, p->vOrder );    // x
//            Vec_IntPushUniqueOrder( p->vTempM[k], iFan0 );    // x
        if ( k == 2 || k == 3 )
            Vec_IntPushUniqueOrderCost( p->vTempM[k], iFan1, p->vOrder );    // y
//            Vec_IntPushUniqueOrder( p->vTempM[k], iFan1 );    // y
    }

    vConst = Hsh_VecReadEntry( p->pHashC, iConst );

    if ( !Gia_ObjIsXor(pObj) )
        for ( k = 0; k < 2; k++ )
            Vec_IntAppendMinus( p->vTempC[k], vConst, k );

    if ( Gia_ObjIsXor(pObj) )
    {
        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntAppendMinus( p->vTempC[0], vConst, 0 );
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[1] );   //  C * x 

        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntAppendMinus( p->vTempC[0], vConst, 0 );
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[2] );   //  C * y 

        //if ( !p->pGia->vXors || Vec_IntFind(p->pGia->vXors, iDriver) == -1 || Vec_IntFind(p->pGia->vXors, iDriver) == 5 )
        { 
            vConst = Hsh_VecReadEntry( p->pHashC, iConst );
            Vec_IntAppendMinus2x( p->vTempC[0], vConst );
            Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   // -C * x * y 
        }
    }
    else if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )  //  C * (1 - x) * (1 - y)
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[0] );   //  C * 1
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[1] );   // -C * x
        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        for ( k = 0; k < 2; k++ )
            Vec_IntAppendMinus( p->vTempC[k], vConst, k );
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[2] );   // -C * y 
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   //  C * x * y
    }
    else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) ) //  C * (1 - x) * y
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[2] );   //  C * y 
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[3] );   // -C * x * y
    }
    else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) ) //  C * x * (1 - y)
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[1] );   //  C * x 
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[3] );   // -C * x * y
    }
    else   
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   //  C * x * y
}